

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Convolution3DLayerParams::MergeFrom
          (Convolution3DLayerParams *this,Convolution3DLayerParams *from)

{
  LogMessage *other;
  WeightParams *pWVar1;
  undefined1 *puVar2;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x5ff2);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  google::protobuf::RepeatedField<unsigned_long>::MergeFrom(&this->outputshape_,&from->outputshape_)
  ;
  if ((from != (Convolution3DLayerParams *)_Convolution3DLayerParams_default_instance_) &&
     (from->weights_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_weights(this);
    puVar2 = (undefined1 *)from->weights_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if ((from != (Convolution3DLayerParams *)_Convolution3DLayerParams_default_instance_) &&
     (from->bias_ != (WeightParams *)0x0)) {
    pWVar1 = _internal_mutable_bias(this);
    puVar2 = (undefined1 *)from->bias_;
    if ((WeightParams *)puVar2 == (WeightParams *)0x0) {
      puVar2 = _WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar1,(WeightParams *)puVar2);
  }
  if (from->outputchannels_ != 0) {
    this->outputchannels_ = from->outputchannels_;
  }
  if (from->inputchannels_ != 0) {
    this->inputchannels_ = from->inputchannels_;
  }
  if (from->ngroups_ != 0) {
    this->ngroups_ = from->ngroups_;
  }
  if (from->kerneldepth_ != 0) {
    this->kerneldepth_ = from->kerneldepth_;
  }
  if (from->kernelheight_ != 0) {
    this->kernelheight_ = from->kernelheight_;
  }
  if (from->kernelwidth_ != 0) {
    this->kernelwidth_ = from->kernelwidth_;
  }
  if (from->stridedepth_ != 0) {
    this->stridedepth_ = from->stridedepth_;
  }
  if (from->strideheight_ != 0) {
    this->strideheight_ = from->strideheight_;
  }
  if (from->stridewidth_ != 0) {
    this->stridewidth_ = from->stridewidth_;
  }
  if (from->dilationdepth_ != 0) {
    this->dilationdepth_ = from->dilationdepth_;
  }
  if (from->dilationheight_ != 0) {
    this->dilationheight_ = from->dilationheight_;
  }
  if (from->dilationwidth_ != 0) {
    this->dilationwidth_ = from->dilationwidth_;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  if (from->isdeconvolution_ == true) {
    this->isdeconvolution_ = true;
  }
  if (from->paddingtype_ != 0) {
    this->paddingtype_ = from->paddingtype_;
  }
  if (from->custompaddingfront_ != 0) {
    this->custompaddingfront_ = from->custompaddingfront_;
  }
  if (from->custompaddingback_ != 0) {
    this->custompaddingback_ = from->custompaddingback_;
  }
  if (from->custompaddingtop_ != 0) {
    this->custompaddingtop_ = from->custompaddingtop_;
  }
  if (from->custompaddingbottom_ != 0) {
    this->custompaddingbottom_ = from->custompaddingbottom_;
  }
  if (from->custompaddingleft_ != 0) {
    this->custompaddingleft_ = from->custompaddingleft_;
  }
  if (from->custompaddingright_ != 0) {
    this->custompaddingright_ = from->custompaddingright_;
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Convolution3DLayerParams::MergeFrom(const Convolution3DLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.Convolution3DLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  outputshape_.MergeFrom(from.outputshape_);
  if (from._internal_has_weights()) {
    _internal_mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_weights());
  }
  if (from._internal_has_bias()) {
    _internal_mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from._internal_bias());
  }
  if (from._internal_outputchannels() != 0) {
    _internal_set_outputchannels(from._internal_outputchannels());
  }
  if (from._internal_inputchannels() != 0) {
    _internal_set_inputchannels(from._internal_inputchannels());
  }
  if (from._internal_ngroups() != 0) {
    _internal_set_ngroups(from._internal_ngroups());
  }
  if (from._internal_kerneldepth() != 0) {
    _internal_set_kerneldepth(from._internal_kerneldepth());
  }
  if (from._internal_kernelheight() != 0) {
    _internal_set_kernelheight(from._internal_kernelheight());
  }
  if (from._internal_kernelwidth() != 0) {
    _internal_set_kernelwidth(from._internal_kernelwidth());
  }
  if (from._internal_stridedepth() != 0) {
    _internal_set_stridedepth(from._internal_stridedepth());
  }
  if (from._internal_strideheight() != 0) {
    _internal_set_strideheight(from._internal_strideheight());
  }
  if (from._internal_stridewidth() != 0) {
    _internal_set_stridewidth(from._internal_stridewidth());
  }
  if (from._internal_dilationdepth() != 0) {
    _internal_set_dilationdepth(from._internal_dilationdepth());
  }
  if (from._internal_dilationheight() != 0) {
    _internal_set_dilationheight(from._internal_dilationheight());
  }
  if (from._internal_dilationwidth() != 0) {
    _internal_set_dilationwidth(from._internal_dilationwidth());
  }
  if (from._internal_hasbias() != 0) {
    _internal_set_hasbias(from._internal_hasbias());
  }
  if (from._internal_isdeconvolution() != 0) {
    _internal_set_isdeconvolution(from._internal_isdeconvolution());
  }
  if (from._internal_paddingtype() != 0) {
    _internal_set_paddingtype(from._internal_paddingtype());
  }
  if (from._internal_custompaddingfront() != 0) {
    _internal_set_custompaddingfront(from._internal_custompaddingfront());
  }
  if (from._internal_custompaddingback() != 0) {
    _internal_set_custompaddingback(from._internal_custompaddingback());
  }
  if (from._internal_custompaddingtop() != 0) {
    _internal_set_custompaddingtop(from._internal_custompaddingtop());
  }
  if (from._internal_custompaddingbottom() != 0) {
    _internal_set_custompaddingbottom(from._internal_custompaddingbottom());
  }
  if (from._internal_custompaddingleft() != 0) {
    _internal_set_custompaddingleft(from._internal_custompaddingleft());
  }
  if (from._internal_custompaddingright() != 0) {
    _internal_set_custompaddingright(from._internal_custompaddingright());
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}